

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTDMT_compress_advanced_internal
                 (ZSTDMT_CCtx *mtctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,
                 ZSTD_CDict *cdict,ZSTD_CCtx_params params)

{
  serialState_t *serialState;
  void *__dest;
  pthread_mutex_t *__mutex;
  ZSTDMT_seqPool *seqPool;
  ulong __n;
  ZSTD_CCtx *cctx;
  undefined1 auVar1 [16];
  U32 nbWorkers;
  undefined1 auVar2 [12];
  ZSTD_CCtx_params ZVar3;
  ZSTD_frameParameters fParams;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  buffer_t *pbVar10;
  ZSTDMT_jobDescription *pZVar11;
  unsigned_long_long uVar12;
  ulong uVar13;
  long lVar14;
  size_t sVar15;
  ZSTD_CDict *pZVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ZSTD_CCtx_params *pZVar22;
  undefined8 *puVar23;
  ulong uVar24;
  size_t sVar25;
  long lVar26;
  byte bVar27;
  buffer_t buf;
  buffer_t dstAsBuffer;
  buffer_t dstBuffer;
  ZSTD_CCtx_params jobParams;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  undefined1 auVar28 [12];
  undefined1 auVar29 [24];
  undefined1 in_stack_fffffffffffffe28 [128];
  undefined1 auVar30 [24];
  buffer_t local_e8;
  void *local_d8;
  size_t sStack_d0;
  ZSTD_CCtx_params local_c8;
  
  ZVar3 = params;
  bVar27 = 0;
  local_c8._0_8_ = params._0_8_;
  local_c8.cParams._4_8_ = params.cParams._4_8_;
  local_c8.fParams._0_8_ = params.fParams._0_8_;
  local_c8.srcSizeHint = params.srcSizeHint;
  local_c8.attachDictPref = params.attachDictPref;
  local_c8.fParams.noDictIDFlag = ZVar3.fParams.noDictIDFlag;
  local_c8.compressionLevel = ZVar3.compressionLevel;
  local_c8.targetCBlockSize = params.targetCBlockSize;
  local_c8.cParams.searchLog = params.cParams.searchLog;
  local_c8.cParams.minMatch = params.cParams.minMatch;
  local_c8.cParams.targetLength = params.cParams.targetLength;
  local_c8.cParams.strategy = params.cParams.strategy;
  local_c8._48_8_ = params._48_8_ & 0xffffffff00000000;
  local_c8.ldmParams.minMatchLength = 0;
  local_c8.ldmParams.hashRateLog = 0;
  local_c8._116_8_ = 0;
  local_c8.customMem._4_8_ = 0;
  local_c8.customMem._12_8_ = 0;
  local_c8.customMem.opaque._4_4_ = 0;
  local_c8.nbWorkers = 0;
  local_c8.jobSize._0_4_ = 0;
  local_c8._84_8_ = 0;
  local_c8.rsyncable = 0;
  local_c8.ldmParams.enableLdm = 0;
  local_c8.ldmParams.hashLog = 0;
  local_c8.ldmParams.bucketSizeLog = 0;
  local_c8.literalCompressionMode = params.literalCompressionMode;
  sVar6 = ZSTDMT_computeOverlapSize(&params);
  uVar13 = (ulong)(uint)params.nbWorkers;
  if (uVar13 == 0) {
    __assert_fail("nbWorkers>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4f2f,
                  "unsigned int ZSTDMT_computeNbJobs(const ZSTD_CCtx_params *, size_t, unsigned int)"
                 );
  }
  if (params.ldmParams.enableLdm == 0) {
    uVar4 = params.cParams.windowLog + 2;
    uVar19 = 0x14;
    if (0x13 < uVar4) goto LAB_001613ad;
  }
  else {
    uVar4 = params.cParams.chainLog + 4;
    uVar19 = 0x15;
    if (0x14 < uVar4) {
LAB_001613ad:
      uVar19 = 0x1e;
      if (uVar4 < 0x1e) {
        uVar19 = uVar4;
      }
    }
  }
  uVar4 = (int)(srcSize / (uVar13 << ((byte)uVar19 + 2 & 0x3f))) + 1;
  uVar19 = (int)(srcSize >> ((byte)uVar19 & 0x3f)) + 1;
  uVar20 = (ulong)uVar19;
  if ((uint)params.nbWorkers <= uVar19) {
    uVar20 = uVar13;
  }
  if (1 < uVar4) {
    uVar20 = (ulong)(uVar4 * params.nbWorkers);
  }
  nbWorkers = (U32)uVar20;
  auVar28._8_4_ = 0;
  auVar28._0_8_ = uVar20;
  auVar2._8_4_ = 0;
  auVar2._0_8_ = (nbWorkers - 1) + srcSize;
  uVar7 = SUB128(auVar2 / auVar28,0);
  uVar13 = uVar7 + 0xffff;
  if (0x7ffe < (SUB124(auVar2 / auVar28,0) - 1U & 0x1ffff)) {
    uVar13 = uVar7;
  }
  uVar7 = (ulong)(0x20000U - (int)srcSize >> 0xb);
  if (0x1ffff < srcSize) {
    uVar7 = 0;
  }
  uVar8 = uVar20;
  if (dstCapacity < uVar7 + (srcSize >> 8) + srcSize) {
    uVar7 = (ulong)(0x20000U - (int)uVar13 >> 0xb);
    if (0x1ffff < uVar13) {
      uVar7 = 0;
    }
    uVar8 = dstCapacity / (uVar7 + (uVar13 >> 8) + uVar13);
  }
  if (mtctx->cctxPool->totalCCtx != params.nbWorkers) {
    __assert_fail("mtctx->cctxPool->totalCCtx == params.nbWorkers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4f4e,
                  "size_t ZSTDMT_compress_advanced_internal(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_CCtx_params)"
                 );
  }
  params.jobSize = uVar13 & 0xffffffff;
  if ((params.nbWorkers < 2) || (nbWorkers == 1)) {
    cctx = mtctx->cctxPool->cctx[0];
    if (cdict == (ZSTD_CDict *)0x0) {
      sVar6 = ZSTD_compress_advanced_internal
                        (cctx,dst,dstCapacity,src,srcSize,(void *)0x0,0,&local_c8);
      return sVar6;
    }
    fParams.noDictIDFlag = local_c8.fParams.noDictIDFlag;
    fParams.contentSizeFlag = local_c8.fParams.contentSizeFlag;
    fParams.checksumFlag = local_c8.fParams.checksumFlag;
    sVar6 = ZSTD_compressBegin_usingCDict_advanced(cctx,cdict,fParams,srcSize);
    if (0xffffffffffffff88 < sVar6) {
      return sVar6;
    }
    sVar6 = ZSTD_compressEnd(cctx,dst,dstCapacity,src,srcSize);
    return sVar6;
  }
  if (uVar13 < 0x40000) {
    __assert_fail("avgJobSize >= 256 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4f5b,
                  "size_t ZSTDMT_compress_advanced_internal(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_CCtx_params)"
                 );
  }
  __mutex = (pthread_mutex_t *)mtctx->bufPool;
  pthread_mutex_lock(__mutex);
  __mutex[1].__align = (uVar13 >> 8) + uVar13;
  pthread_mutex_unlock(__mutex);
  serialState = &mtctx->serial;
  seqPool = mtctx->seqPool;
  pZVar22 = &params;
  puVar23 = (undefined8 *)&stack0xfffffffffffffe18;
  for (lVar14 = 0x12; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar23 = *(undefined8 *)pZVar22;
    pZVar22 = (ZSTD_CCtx_params *)((long)pZVar22 + (ulong)bVar27 * -0x10 + 8);
    puVar23 = puVar23 + (ulong)bVar27 * -2 + 1;
  }
  ZVar3.cParams.chainLog = (int)in_stack_fffffffffffffe20;
  ZVar3.cParams.hashLog = (int)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  ZVar3.format = (int)in_stack_fffffffffffffe18;
  ZVar3.cParams.windowLog = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  auVar28 = in_stack_fffffffffffffe28._16_12_;
  auVar29 = in_stack_fffffffffffffe28._80_24_;
  auVar30 = in_stack_fffffffffffffe28._104_24_;
  ZVar3.cParams.searchLog = in_stack_fffffffffffffe28._0_4_;
  ZVar3.cParams.minMatch = in_stack_fffffffffffffe28._4_4_;
  ZVar3.cParams.targetLength = in_stack_fffffffffffffe28._8_4_;
  ZVar3.cParams.strategy = in_stack_fffffffffffffe28._12_4_;
  ZVar3.fParams.contentSizeFlag = auVar28._0_4_;
  ZVar3.fParams.checksumFlag = auVar28._4_4_;
  ZVar3.fParams.noDictIDFlag = auVar28._8_4_;
  ZVar3.compressionLevel = in_stack_fffffffffffffe28._28_4_;
  ZVar3.forceWindow = in_stack_fffffffffffffe28._32_4_;
  ZVar3._52_4_ = in_stack_fffffffffffffe28._36_4_;
  ZVar3.targetCBlockSize = in_stack_fffffffffffffe28._40_8_;
  ZVar3.srcSizeHint = in_stack_fffffffffffffe28._48_4_;
  ZVar3.attachDictPref = in_stack_fffffffffffffe28._52_4_;
  ZVar3.literalCompressionMode = in_stack_fffffffffffffe28._56_4_;
  ZVar3.nbWorkers = in_stack_fffffffffffffe28._60_4_;
  ZVar3.jobSize = in_stack_fffffffffffffe28._64_8_;
  ZVar3.overlapLog = in_stack_fffffffffffffe28._72_4_;
  ZVar3.rsyncable = in_stack_fffffffffffffe28._76_4_;
  ZVar3.ldmParams.enableLdm = auVar29._0_4_;
  ZVar3.ldmParams.hashLog = auVar29._4_4_;
  ZVar3.ldmParams.bucketSizeLog = auVar29._8_4_;
  ZVar3.ldmParams.minMatchLength = auVar29._12_4_;
  ZVar3.ldmParams.hashRateLog = auVar29._16_4_;
  ZVar3.ldmParams.windowLog = auVar29._20_4_;
  ZVar3.customMem.customAlloc = (ZSTD_allocFunction)auVar30._0_8_;
  ZVar3.customMem.customFree = (ZSTD_freeFunction)auVar30._8_8_;
  ZVar3.customMem.opaque = (void *)auVar30._16_8_;
  iVar5 = ZSTDMT_serialState_reset(serialState,seqPool,ZVar3,uVar13,(void *)0x0,0);
  if (iVar5 != 0) {
    return 0xffffffffffffffc0;
  }
  sVar9 = ZSTDMT_expandJobsTable(mtctx,nbWorkers);
  if (0xffffffffffffff88 < sVar9) {
    return sVar9;
  }
  if (nbWorkers != 0) {
    lVar26 = 0xbc;
    uVar7 = 0;
    lVar14 = 0;
    lVar18 = 0;
    sVar9 = srcSize;
    do {
      uVar21 = uVar13;
      if (sVar9 < uVar13) {
        uVar21 = sVar9;
      }
      uVar24 = (ulong)(0x20000U - (int)uVar21 >> 0xb);
      if (0x1ffff < uVar21) {
        uVar24 = 0;
      }
      sVar25 = uVar24 + (uVar21 >> 8) + uVar21;
      local_e8.start = (void *)((long)dst + lVar18);
      pbVar10 = &g_nullBuffer;
      if (uVar7 < (uVar8 & 0xffffffff)) {
        pbVar10 = &local_e8;
      }
      local_e8.capacity = sVar25;
      local_d8 = pbVar10->start;
      sStack_d0 = pbVar10->capacity;
      sVar15 = sVar6;
      if (uVar7 == 0) {
        sVar15 = 0;
      }
      pZVar11 = mtctx->jobs;
      *(size_t *)((long)pZVar11 + lVar26 + -0x24) = (lVar14 + (long)src) - sVar15;
      *(size_t *)((long)pZVar11 + lVar26 + -0x1c) = sVar15;
      *(long *)((long)pZVar11 + lVar26 + -0x14) = lVar14 + (long)src;
      *(ulong *)((long)pZVar11 + lVar26 + -0xc) = uVar21;
      if (sVar9 == 0) {
        __assert_fail("jobSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4f6d,
                      "size_t ZSTDMT_compress_advanced_internal(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_CCtx_params)"
                     );
      }
      pZVar16 = (ZSTD_CDict *)0x0;
      if (uVar7 == 0) {
        pZVar16 = cdict;
      }
      __dest = (void *)((long)&pZVar11->cSize + lVar26 + 4);
      *(undefined1 (*) [16])((long)__dest + -200) = ZEXT816(0) << 0x20;
      *(ZSTD_CDict **)((long)__dest + 0x90) = pZVar16;
      *(size_t *)((long)__dest + 0x98) = srcSize;
      memcpy(__dest,&local_c8,0x90);
      puVar23 = (undefined8 *)((long)mtctx->jobs + lVar26 + -0x34);
      *puVar23 = local_d8;
      puVar23[1] = sStack_d0;
      pZVar11 = mtctx->jobs;
      auVar1._0_8_ = mtctx->bufPool;
      auVar1._8_8_ = mtctx->cctxPool;
      auVar1 = vpermilps_avx(auVar1,0x4e);
      *(undefined1 (*) [16])((long)pZVar11 + lVar26 + -0x54) = auVar1;
      *(ZSTDMT_seqPool **)((long)pZVar11 + lVar26 + -0x44) = mtctx->seqPool;
      *(serialState_t **)((long)pZVar11 + lVar26 + -0x3c) = serialState;
      *(int *)((long)pZVar11 + lVar26 + -4) = (int)uVar7;
      auVar1 = vpinsrb_avx(ZEXT416((uint)CONCAT71((int7)(sVar15 >> 8),uVar7 == 0)),
                           (int)CONCAT71((int7)((ulong)serialState >> 8),nbWorkers - 1 == uVar7),8);
      auVar1 = vpshufd_avx(auVar1,0xe8);
      auVar1 = vpand_avx(auVar1,_DAT_001b5b20);
      *(long *)((long)&pZVar11->consumed + lVar26) = auVar1._0_8_;
      POOL_add(mtctx->factory,ZSTDMT_compressionJob,(void *)(lVar26 + -0xbc + (long)pZVar11));
      lVar14 = lVar14 + uVar21;
      lVar18 = lVar18 + sVar25;
      sVar9 = sVar9 - uVar21;
      uVar7 = uVar7 + 1;
      lVar26 = lVar26 + 0x178;
    } while (uVar20 != uVar7);
    if (nbWorkers != 0) {
      pZVar11 = mtctx->jobs;
      uVar24 = 0;
      uVar7 = 0;
      uVar21 = 0;
      do {
        pthread_mutex_lock((pthread_mutex_t *)&pZVar11[uVar24].job_mutex);
        pZVar11 = mtctx->jobs;
        if (pZVar11[uVar24].consumed < pZVar11[uVar24].src.size) {
          do {
            pthread_cond_wait((pthread_cond_t *)&pZVar11[uVar24].job_cond,
                              (pthread_mutex_t *)&pZVar11[uVar24].job_mutex);
            pZVar11 = mtctx->jobs;
          } while (pZVar11[uVar24].consumed < pZVar11[uVar24].src.size);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&pZVar11[uVar24].job_mutex);
        pZVar11 = mtctx->jobs;
        __n = pZVar11[uVar24].cSize;
        uVar17 = uVar7;
        if (0xffffffffffffff88 < __n) {
          uVar17 = __n;
        }
        uVar13 = __n + uVar21;
        uVar7 = 0;
        if (dstCapacity < uVar13) {
          uVar7 = 0xffffffffffffffba;
        }
        if (uVar17 != 0) {
          uVar7 = uVar17;
        }
        if (uVar24 != 0) {
          if (uVar7 == 0) {
            memmove((void *)(uVar21 + (long)dst),pZVar11[uVar24].dstBuff.start,__n);
            pZVar11 = mtctx->jobs;
          }
          if ((uVar8 & 0xffffffff) <= uVar24) {
            buf.capacity = pZVar11[uVar24].dstBuff.capacity;
            buf.start = pZVar11[uVar24].dstBuff.start;
            ZSTDMT_releaseBuffer(mtctx->bufPool,buf);
            pZVar11 = mtctx->jobs;
          }
        }
        pZVar11[uVar24].dstBuff.start = (void *)0x0;
        pZVar11[uVar24].dstBuff.capacity = 0;
        pZVar11 = mtctx->jobs;
        pZVar11[uVar24].cSize = 0;
        uVar24 = uVar24 + 1;
        uVar21 = uVar13;
      } while (uVar24 != uVar20);
      goto LAB_0016196a;
    }
  }
  uVar13 = 0;
  uVar7 = 0;
LAB_0016196a:
  if (params.fParams.checksumFlag != 0) {
    if (dstCapacity < uVar13 + 4) {
      return 0xffffffffffffffba;
    }
    uVar12 = ZSTD_XXH64_digest(&(mtctx->serial).xxhState);
    *(int *)((long)dst + uVar13) = (int)uVar12;
    uVar13 = uVar13 + 4;
  }
  if (uVar7 != 0) {
    uVar13 = uVar7;
  }
  return uVar13;
}

Assistant:

static size_t ZSTDMT_compress_advanced_internal(
                ZSTDMT_CCtx* mtctx,
                void* dst, size_t dstCapacity,
          const void* src, size_t srcSize,
          const ZSTD_CDict* cdict,
                ZSTD_CCtx_params params)
{
    ZSTD_CCtx_params const jobParams = ZSTDMT_initJobCCtxParams(&params);
    size_t const overlapSize = ZSTDMT_computeOverlapSize(&params);
    unsigned const nbJobs = ZSTDMT_computeNbJobs(&params, srcSize, params.nbWorkers);
    size_t const proposedJobSize = (srcSize + (nbJobs-1)) / nbJobs;
    size_t const avgJobSize = (((proposedJobSize-1) & 0x1FFFF) < 0x7FFF) ? proposedJobSize + 0xFFFF : proposedJobSize;   /* avoid too small last block */
    const char* const srcStart = (const char*)src;
    size_t remainingSrcSize = srcSize;
    unsigned const compressWithinDst = (dstCapacity >= ZSTD_compressBound(srcSize)) ? nbJobs : (unsigned)(dstCapacity / ZSTD_compressBound(avgJobSize));  /* presumes avgJobSize >= 256 KB, which should be the case */
    size_t frameStartPos = 0, dstBufferPos = 0;
    assert(jobParams.nbWorkers == 0);
    assert(mtctx->cctxPool->totalCCtx == params.nbWorkers);

    params.jobSize = (U32)avgJobSize;
    DEBUGLOG(4, "ZSTDMT_compress_advanced_internal: nbJobs=%2u (rawSize=%u bytes; fixedSize=%u) ",
                nbJobs, (U32)proposedJobSize, (U32)avgJobSize);

    if ((nbJobs==1) | (params.nbWorkers<=1)) {   /* fallback to single-thread mode : this is a blocking invocation anyway */
        ZSTD_CCtx* const cctx = mtctx->cctxPool->cctx[0];
        DEBUGLOG(4, "ZSTDMT_compress_advanced_internal: fallback to single-thread mode");
        if (cdict) return ZSTD_compress_usingCDict_advanced(cctx, dst, dstCapacity, src, srcSize, cdict, jobParams.fParams);
        return ZSTD_compress_advanced_internal(cctx, dst, dstCapacity, src, srcSize, NULL, 0, &jobParams);
    }

    assert(avgJobSize >= 256 KB);  /* condition for ZSTD_compressBound(A) + ZSTD_compressBound(B) <= ZSTD_compressBound(A+B), required to compress directly into Dst (no additional buffer) */
    ZSTDMT_setBufferSize(mtctx->bufPool, ZSTD_compressBound(avgJobSize) );
    if (ZSTDMT_serialState_reset(&mtctx->serial, mtctx->seqPool, params, avgJobSize, NULL, 0))
        return ERROR(memory_allocation);

    FORWARD_IF_ERROR( ZSTDMT_expandJobsTable(mtctx, nbJobs) );  /* only expands if necessary */

    {   unsigned u;
        for (u=0; u<nbJobs; u++) {
            size_t const jobSize = MIN(remainingSrcSize, avgJobSize);
            size_t const dstBufferCapacity = ZSTD_compressBound(jobSize);
            buffer_t const dstAsBuffer = { (char*)dst + dstBufferPos, dstBufferCapacity };
            buffer_t const dstBuffer = u < compressWithinDst ? dstAsBuffer : g_nullBuffer;
            size_t dictSize = u ? overlapSize : 0;

            mtctx->jobs[u].prefix.start = srcStart + frameStartPos - dictSize;
            mtctx->jobs[u].prefix.size = dictSize;
            mtctx->jobs[u].src.start = srcStart + frameStartPos;
            mtctx->jobs[u].src.size = jobSize; assert(jobSize > 0);  /* avoid job.src.size == 0 */
            mtctx->jobs[u].consumed = 0;
            mtctx->jobs[u].cSize = 0;
            mtctx->jobs[u].cdict = (u==0) ? cdict : NULL;
            mtctx->jobs[u].fullFrameSize = srcSize;
            mtctx->jobs[u].params = jobParams;
            /* do not calculate checksum within sections, but write it in header for first section */
            mtctx->jobs[u].dstBuff = dstBuffer;
            mtctx->jobs[u].cctxPool = mtctx->cctxPool;
            mtctx->jobs[u].bufPool = mtctx->bufPool;
            mtctx->jobs[u].seqPool = mtctx->seqPool;
            mtctx->jobs[u].serial = &mtctx->serial;
            mtctx->jobs[u].jobID = u;
            mtctx->jobs[u].firstJob = (u==0);
            mtctx->jobs[u].lastJob = (u==nbJobs-1);

            DEBUGLOG(5, "ZSTDMT_compress_advanced_internal: posting job %u  (%u bytes)", u, (U32)jobSize);
            DEBUG_PRINTHEX(6, mtctx->jobs[u].prefix.start, 12);
            POOL_add(mtctx->factory, ZSTDMT_compressionJob, &mtctx->jobs[u]);

            frameStartPos += jobSize;
            dstBufferPos += dstBufferCapacity;
            remainingSrcSize -= jobSize;
    }   }

    /* collect result */
    {   size_t error = 0, dstPos = 0;
        unsigned jobID;
        for (jobID=0; jobID<nbJobs; jobID++) {
            DEBUGLOG(5, "waiting for job %u ", jobID);
            ZSTD_PTHREAD_MUTEX_LOCK(&mtctx->jobs[jobID].job_mutex);
            while (mtctx->jobs[jobID].consumed < mtctx->jobs[jobID].src.size) {
                DEBUGLOG(5, "waiting for jobCompleted signal from job %u", jobID);
                ZSTD_pthread_cond_wait(&mtctx->jobs[jobID].job_cond, &mtctx->jobs[jobID].job_mutex);
            }
            ZSTD_pthread_mutex_unlock(&mtctx->jobs[jobID].job_mutex);
            DEBUGLOG(5, "ready to write job %u ", jobID);

            {   size_t const cSize = mtctx->jobs[jobID].cSize;
                if (ZSTD_isError(cSize)) error = cSize;
                if ((!error) && (dstPos + cSize > dstCapacity)) error = ERROR(dstSize_tooSmall);
                if (jobID) {   /* note : job 0 is written directly at dst, which is correct position */
                    if (!error)
                        memmove((char*)dst + dstPos, mtctx->jobs[jobID].dstBuff.start, cSize);  /* may overlap when job compressed within dst */
                    if (jobID >= compressWithinDst) {  /* job compressed into its own buffer, which must be released */
                        DEBUGLOG(5, "releasing buffer %u>=%u", jobID, compressWithinDst);
                        ZSTDMT_releaseBuffer(mtctx->bufPool, mtctx->jobs[jobID].dstBuff);
                }   }
                mtctx->jobs[jobID].dstBuff = g_nullBuffer;
                mtctx->jobs[jobID].cSize = 0;
                dstPos += cSize ;
            }
        }  /* for (jobID=0; jobID<nbJobs; jobID++) */

        DEBUGLOG(4, "checksumFlag : %u ", params.fParams.checksumFlag);
        if (params.fParams.checksumFlag) {
            U32 const checksum = (U32)XXH64_digest(&mtctx->serial.xxhState);
            if (dstPos + 4 > dstCapacity) {
                error = ERROR(dstSize_tooSmall);
            } else {
                DEBUGLOG(4, "writing checksum : %08X \n", checksum);
                MEM_writeLE32((char*)dst + dstPos, checksum);
                dstPos += 4;
        }   }

        if (!error) DEBUGLOG(4, "compressed size : %u  ", (U32)dstPos);
        return error ? error : dstPos;
    }
}